

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QTabBar::setTabEnabled(QTabBar *this,int index,bool enabled)

{
  QTabBarPrivate *this_00;
  Tab *pTVar1;
  bool bVar2;
  int index_00;
  
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((ulong)(long)index < (ulong)(this_00->tabList).d.size) &&
     (pTVar1 = (this_00->tabList).d.ptr[index], pTVar1 != (Tab *)0x0)) {
    pTVar1->field_0xe4 = pTVar1->field_0xe4 & 0xfe | enabled;
    QWidget::setShortcutEnabled(&this->super_QWidget,pTVar1->shortcutId,enabled);
    QWidget::update(&this->super_QWidget);
    if (enabled) {
      bVar2 = isTabVisible(this,this_00->currentIndex);
      if (!bVar2) {
LAB_0044f76b:
        index_00 = QTabBarPrivate::selectNewCurrentIndexFrom(this_00,index);
        setCurrentIndex(this,index_00);
        return;
      }
    }
    else if (this_00->currentIndex == index) {
      index = index + 1;
      goto LAB_0044f76b;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }